

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniFB_GL.c
# Opt level: O3

_Bool create_GL_context(SWindowData *window_data)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  long lVar3;
  bool bVar4;
  undefined8 *puVar5;
  undefined8 *puVar6;
  byte bVar7;
  GLint minorGLX;
  GLint majorGLX;
  GLint glxAttribs [21];
  int local_8c;
  undefined8 local_88 [10];
  undefined4 local_38;
  
  bVar7 = 0;
  puVar1 = (undefined8 *)window_data->specific;
  glXQueryVersion(puVar1[1],&local_8c);
  if (local_8c < 2) {
    create_GL_context_cold_2();
    bVar4 = false;
  }
  else {
    puVar5 = &DAT_00105b50;
    puVar6 = local_88;
    for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
      *puVar6 = *puVar5;
      puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
      puVar6 = puVar6 + (ulong)bVar7 * -2 + 1;
    }
    local_38 = 0;
    lVar3 = glXChooseVisual(puVar1[1],*(undefined4 *)(puVar1 + 2));
    bVar4 = lVar3 != 0;
    if (lVar3 == 0) {
      create_GL_context_cold_1();
    }
    else {
      uVar2 = glXCreateContext(puVar1[1],lVar3,0,1);
      puVar1[4] = uVar2;
      glXMakeCurrent(puVar1[1],*puVar1,uVar2);
      init_GL(window_data);
    }
  }
  return bVar4;
}

Assistant:

bool 
create_GL_context(SWindowData *window_data) {
#if defined(_WIN32) || defined(WIN32)
    SWindowData_Win *window_data_win = (SWindowData_Win *) window_data->specific;

    if(setup_pixel_format(window_data_win->hdc) == false)
        return false;
    window_data_win->hGLRC = wglCreateContext(window_data_win->hdc);
    wglMakeCurrent(window_data_win->hdc, window_data_win->hGLRC);
    init_GL(window_data);

    return true;

#elif defined(linux)
    SWindowData_X11 *window_data_x11 = (SWindowData_X11 *) window_data->specific;

    GLint majorGLX, minorGLX = 0;
    glXQueryVersion(window_data_x11->display, &majorGLX, &minorGLX);
    if (majorGLX <= 1 && minorGLX < 2) {
        fprintf(stderr, "GLX 1.2 or greater is required.\n");
        XCloseDisplay(window_data_x11->display);
        return false;
    }
    else {
        //fprintf(stdout, "GLX version: %d.%d\n", majorGLX, minorGLX);
    }

    GLint glxAttribs[] = {
        GLX_RGBA,
        GLX_DOUBLEBUFFER,
        GLX_DEPTH_SIZE,     24,
        GLX_STENCIL_SIZE,   8,
        GLX_RED_SIZE,       8,
        GLX_GREEN_SIZE,     8,
        GLX_BLUE_SIZE,      8,
        GLX_DEPTH_SIZE,     24,
        GLX_STENCIL_SIZE,   8,
        GLX_SAMPLE_BUFFERS, 0,
        GLX_SAMPLES,        0,
        None
    };
    XVisualInfo* visualInfo = glXChooseVisual(window_data_x11->display, window_data_x11->screen, glxAttribs);
    if (visualInfo == 0) {
        fprintf(stderr, "Could not create correct visual window.\n");
        XCloseDisplay(window_data_x11->display);
        return false;
    }

    window_data_x11->context = glXCreateContext(window_data_x11->display, visualInfo, NULL, GL_TRUE);
    glXMakeCurrent(window_data_x11->display, window_data_x11->window, window_data_x11->context);

    //fprintf(stdout, "GL Vendor: %s\n", glGetString(GL_VENDOR));
    //fprintf(stdout, "GL Renderer: %s\n", glGetString(GL_RENDERER));
    //fprintf(stdout, "GL Version: %s\n", glGetString(GL_VERSION));
    //fprintf(stdout, "GL Shading Language: %s\n", glGetString(GL_SHADING_LANGUAGE_VERSION));

    init_GL(window_data);

    return true;
#endif
}